

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_descriptor.cpp
# Opt level: O0

void __thiscall
cfd::core::DescriptorNode::DescriptorNode(DescriptorNode *this,DescriptorNode *object)

{
  DescriptorNode *object_local;
  DescriptorNode *this_local;
  
  ::std::__cxx11::string::string((string *)this);
  ::std::__cxx11::string::string((string *)&this->value_);
  ::std::__cxx11::string::string((string *)&this->key_info_);
  this->is_uncompressed_key_ = false;
  ::std::__cxx11::string::string((string *)&this->base_extkey_);
  ::std::__cxx11::string::string((string *)&this->tweak_sum_);
  this->number_ = 0;
  ::std::vector<cfd::core::DescriptorNode,_std::allocator<cfd::core::DescriptorNode>_>::vector
            (&this->child_node_);
  ::std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::DescriptorNode,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::DescriptorNode>_>_>
  ::map(&this->tree_node_);
  ::std::__cxx11::string::string((string *)&this->checksum_);
  this->depth_ = 0;
  this->need_arg_num_ = 0;
  ::std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::vector
            (&this->addr_prefixes_);
  ::std::__cxx11::string::string((string *)&this->parent_kind_);
  ::std::__cxx11::string::operator=((string *)this,(string *)object);
  ::std::__cxx11::string::operator=((string *)&this->value_,(string *)&object->value_);
  ::std::__cxx11::string::operator=((string *)&this->key_info_,(string *)&object->key_info_);
  this->is_uncompressed_key_ = (bool)(object->is_uncompressed_key_ & 1);
  ::std::__cxx11::string::operator=((string *)&this->base_extkey_,(string *)&object->base_extkey_);
  ::std::__cxx11::string::operator=((string *)&this->tweak_sum_,(string *)&object->tweak_sum_);
  this->number_ = object->number_;
  ::std::vector<cfd::core::DescriptorNode,_std::allocator<cfd::core::DescriptorNode>_>::operator=
            (&this->child_node_,&object->child_node_);
  ::std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::DescriptorNode,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cfd::core::DescriptorNode>_>_>
  ::operator=(&this->tree_node_,&object->tree_node_);
  ::std::__cxx11::string::operator=((string *)&this->checksum_,(string *)&object->checksum_);
  this->depth_ = object->depth_;
  this->need_arg_num_ = object->need_arg_num_;
  this->node_type_ = object->node_type_;
  this->script_type_ = object->script_type_;
  this->key_type_ = object->key_type_;
  ::std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::
  operator=(&this->addr_prefixes_,&object->addr_prefixes_);
  ::std::__cxx11::string::operator=((string *)&this->parent_kind_,(string *)&object->parent_kind_);
  return;
}

Assistant:

DescriptorNode::DescriptorNode(const DescriptorNode& object) {
  name_ = object.name_;
  value_ = object.value_;
  key_info_ = object.key_info_;
  is_uncompressed_key_ = object.is_uncompressed_key_;
  base_extkey_ = object.base_extkey_;
  tweak_sum_ = object.tweak_sum_;
  number_ = object.number_;
  child_node_ = object.child_node_;
  tree_node_ = object.tree_node_;
  checksum_ = object.checksum_;
  depth_ = object.depth_;
  need_arg_num_ = object.need_arg_num_;
  node_type_ = object.node_type_;
  script_type_ = object.script_type_;
  key_type_ = object.key_type_;
  addr_prefixes_ = object.addr_prefixes_;
  parent_kind_ = object.parent_kind_;
}